

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  int *piVar1;
  size_t sVar2;
  pointer piVar3;
  Data2D<int> *pDVar4;
  MultiIndexSet *pMVar5;
  int iVar6;
  int iVar7;
  pointer piVar8;
  Data2D<int> *pDVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  int iVar11;
  long lVar12;
  size_type __n;
  double *pdVar13;
  ulong uVar14;
  int j;
  int iVar15;
  long lVar16;
  size_t i;
  ulong uVar17;
  int j_1;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  reference rVar23;
  _Bit_iterator __first;
  _Bit_iterator __last;
  allocator_type local_125;
  int local_124;
  int local_120;
  int local_11c;
  vector<int,_std::allocator<int>_> *local_118;
  MultiIndexSet *local_110;
  size_type local_108;
  vector<double,_std::allocator<double>_> node;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  
  local_124 = (int)(this->parents).num_strips;
  if (work->cache_num_indexes == local_124) {
    lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lparents.stride = 0;
    lparents.num_strips = 0;
    lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_120 = local_124;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&lparents,work);
    local_120 = (int)(this->parents).num_strips;
    local_124 = work->cache_num_indexes;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&level,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&used);
  iVar11 = 0;
  local_118 = active_points;
  local_110 = work;
  for (uVar17 = 0; pMVar5 = local_110, pvVar10 = local_118,
      piVar8 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar8 >> 2);
      uVar17 = uVar17 + 1) {
    piVar1 = (local_110->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (long)piVar8[uVar17] * local_110->num_dimensions;
    iVar6 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(*piVar1);
    for (lVar16 = 1; lVar16 < (this->super_BaseCanonicalGrid).num_dimensions; lVar16 = lVar16 + 1) {
      iVar7 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(piVar1[lVar16]);
      iVar6 = iVar6 + iVar7;
    }
    if (iVar11 <= iVar6) {
      iVar11 = iVar6;
    }
    level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar17] = iVar6;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_count,(long)this->top_level + 1,
             (allocator_type *)&used);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_tail,(long)this->top_level + 1,
             (allocator_type *)&used);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&used,(long)pMVar5->cache_num_indexes,
             (allocator_type *)&node);
  iVar6 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&node,(long)iVar6,&local_125);
  do {
    if (iVar11 < 1) {
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&node);
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&used);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&level);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&lparents.vec.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    local_11c = iVar11;
    for (uVar17 = 0;
        piVar8 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar17 < (ulong)((long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar8 >> 2);
        uVar17 = uVar17 + 1) {
      if (level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar17] == iVar11) {
        iVar11 = piVar8[uVar17];
        sVar2 = local_110->num_dimensions;
        piVar3 = (local_110->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar16 = 0; lVar16 < (this->super_BaseCanonicalGrid).num_dimensions;
            lVar16 = lVar16 + 1) {
          dVar21 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                             (piVar3[(long)iVar11 * sVar2 + lVar16]);
          node.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar16] = dVar21;
        }
        local_125 = (allocator_type)0x0;
        __first.super__Bit_iterator_base._8_8_ = 0;
        __first.super__Bit_iterator_base._M_p =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._M_offset =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
        std::__fill_a1(__first,__last,(bool *)&local_125);
        *monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = 0;
        *monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar17];
        uVar19 = 0;
        piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = local_11c;
        do {
          uVar19 = (ulong)(int)uVar19;
          while( true ) {
            pvVar10 = local_118;
            if (SBORROW4(*piVar8,iVar6 * 2) == *piVar8 + iVar6 * -2 < 0) goto LAB_001a7910;
            iVar7 = piVar8[uVar19];
            if (SBORROW4(iVar7,iVar6 * 2) != iVar7 + iVar6 * -2 < 0) break;
            uVar19 = uVar19 - 1;
            piVar8[(int)uVar19] = piVar8[(int)uVar19] + 1;
          }
          pDVar9 = &lparents;
          if (local_124 == local_120) {
            pDVar9 = &this->parents;
          }
          pDVar4 = &lparents;
          if (local_124 == local_120) {
            pDVar4 = &this->parents;
          }
          __n = (size_type)
                (pDVar4->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar19] * pDVar9->stride + (long)iVar7];
          if ((__n == 0xffffffffffffffff) ||
             (local_108 = __n,
             rVar23 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&used,__n),
             piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, (*rVar23._M_p & rVar23._M_mask) != 0)) {
            piVar8[uVar19] = piVar8[uVar19] + 1;
          }
          else {
            lVar12 = local_110->num_dimensions * local_108;
            piVar3 = (local_110->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar21 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                               (this->order,piVar3[lVar12],
                                *node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
            lVar16 = 1;
            while( true ) {
              iVar11 = local_11c;
              uVar18 = (this->super_BaseCanonicalGrid).num_dimensions;
              if ((int)uVar18 <= lVar16) break;
              dVar22 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                 (this->order,piVar3[lVar12 + lVar16],
                                  node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar16]);
              dVar21 = dVar21 * dVar22;
              lVar16 = lVar16 + 1;
            }
            piVar8 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = (int)local_108;
            iVar7 = uVar18 * iVar15;
            uVar14 = 0;
            pdVar13 = weights;
            if (0 < (int)uVar18) {
              uVar14 = (ulong)uVar18;
            }
            while (bVar20 = uVar14 != 0, uVar14 = uVar14 - 1, bVar20) {
              pdVar13[iVar7] =
                   pdVar13[iVar7] - pdVar13[(long)piVar8[uVar17] * (long)(int)uVar18] * dVar21;
              pdVar13 = pdVar13 + 1;
            }
            rVar23 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&used,local_108);
            *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
            uVar18 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar18;
            monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar18] = 0;
            monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar18] = iVar15;
            piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
        } while( true );
      }
LAB_001a7910:
    }
    iVar11 = iVar11 + -1;
  } while( true );
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}